

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unisetspan.cpp
# Opt level: O2

void __thiscall
icu_63::UnicodeSetStringSpan::UnicodeSetStringSpan
          (UnicodeSetStringSpan *this,UnicodeSetStringSpan *otherStringSpan,
          UVector *newParentSetStrings)

{
  UnicodeSet *o;
  int iVar1;
  undefined4 extraout_var;
  int32_t *__dest;
  ulong uVar2;
  void *__child_stack;
  UnicodeSet *__fn;
  void *in_R8;
  UnicodeSet *this_00;
  
  this_00 = &this->spanSet;
  o = &otherStringSpan->spanSet;
  __fn = o;
  UnicodeSet::UnicodeSet(this_00,o);
  this->pSpanNotSet = (UnicodeSet *)0x0;
  this->strings = newParentSetStrings;
  this->utf8 = (uint8_t *)0x0;
  this->utf8Lengths = (int32_t *)0x0;
  this->spanLengths = (uint8_t *)0x0;
  uVar2._0_4_ = otherStringSpan->utf8Length;
  uVar2._4_4_ = otherStringSpan->maxLength16;
  this->utf8Length = (undefined4)uVar2;
  this->maxLength16 = uVar2._4_4_;
  this->maxLength8 = otherStringSpan->maxLength8;
  this->all = '\x01';
  if (otherStringSpan->pSpanNotSet != o) {
    iVar1 = UnicodeSet::clone(otherStringSpan->pSpanNotSet,(__fn *)__fn,__child_stack,
                              (undefined4)uVar2,in_R8);
    this_00 = (UnicodeSet *)CONCAT44(extraout_var,iVar1);
    newParentSetStrings = this->strings;
    uVar2 = (ulong)(uint)this->utf8Length;
  }
  this->pSpanNotSet = this_00;
  iVar1 = newParentSetStrings->count;
  uVar2 = (long)(int)uVar2 + (long)iVar1 * 8;
  if ((int)uVar2 < 0x81) {
    __dest = this->staticLengths;
    this->utf8Lengths = __dest;
  }
  else {
    __dest = (int32_t *)uprv_malloc_63(uVar2 & 0xffffffff);
    this->utf8Lengths = __dest;
    if (__dest == (int32_t *)0x0) {
      this->maxLength16 = 0;
      this->maxLength8 = 0;
      return;
    }
  }
  this->spanLengths = (uint8_t *)(__dest + iVar1);
  this->utf8 = (uint8_t *)((long)(iVar1 * 4) + (long)(__dest + iVar1));
  memcpy(__dest,otherStringSpan->utf8Lengths,uVar2);
  return;
}

Assistant:

UnicodeSetStringSpan::UnicodeSetStringSpan(const UnicodeSetStringSpan &otherStringSpan,
                                           const UVector &newParentSetStrings)
        : spanSet(otherStringSpan.spanSet), pSpanNotSet(NULL), strings(newParentSetStrings),
          utf8Lengths(NULL), spanLengths(NULL), utf8(NULL),
          utf8Length(otherStringSpan.utf8Length),
          maxLength16(otherStringSpan.maxLength16), maxLength8(otherStringSpan.maxLength8),
          all(TRUE) {
    if(otherStringSpan.pSpanNotSet==&otherStringSpan.spanSet) {
        pSpanNotSet=&spanSet;
    } else {
        pSpanNotSet=(UnicodeSet *)otherStringSpan.pSpanNotSet->clone();
    }

    // Allocate a block of meta data.
    // UTF-8 lengths, 4 sets of span lengths, UTF-8 strings.
    int32_t stringsLength=strings.size();
    int32_t allocSize=stringsLength*(4+1+1+1+1)+utf8Length;
    if(allocSize<=(int32_t)sizeof(staticLengths)) {
        utf8Lengths=staticLengths;
    } else {
        utf8Lengths=(int32_t *)uprv_malloc(allocSize);
        if(utf8Lengths==NULL) {
            maxLength16=maxLength8=0;  // Prevent usage by making needsStringSpanUTF16/8() return FALSE.
            return;  // Out of memory.
        }
    }

    spanLengths=(uint8_t *)(utf8Lengths+stringsLength);
    utf8=spanLengths+stringsLength*4;
    uprv_memcpy(utf8Lengths, otherStringSpan.utf8Lengths, allocSize);
}